

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsgridlayout.cpp
# Opt level: O0

QGraphicsLayoutItem * __thiscall
QGraphicsGridLayout::itemAt(QGraphicsGridLayout *this,int row,int column)

{
  int iVar1;
  QGraphicsGridLayoutPrivate *pQVar2;
  QGraphicsGridLayoutEngineItem *this_00;
  Orientation in_EDX;
  uint in_ESI;
  char *in_RDI;
  long in_FS_OFFSET;
  QGraphicsGridLayoutEngineItem *engineItem;
  QGraphicsGridLayoutPrivate *d;
  char *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  Orientation OVar3;
  uint in_stack_ffffffffffffffa4;
  QMessageLogger *in_stack_ffffffffffffffb0;
  QGraphicsLayoutItem *local_30;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QGraphicsGridLayout *)0x96e0b2);
  if (-1 < (int)in_ESI) {
    in_stack_ffffffffffffffa4 = in_ESI;
    iVar1 = rowCount((QGraphicsGridLayout *)CONCAT44(in_ESI,in_stack_ffffffffffffffa0));
    if (((int)in_stack_ffffffffffffffa4 < iVar1) && (-1 < (int)in_EDX)) {
      OVar3 = in_EDX;
      iVar1 = columnCount((QGraphicsGridLayout *)CONCAT44(in_stack_ffffffffffffffa4,in_EDX));
      if ((int)OVar3 < iVar1) {
        this_00 = (QGraphicsGridLayoutEngineItem *)
                  QGridLayoutEngine::itemAt((int)pQVar2 + 0x118,in_ESI,in_EDX);
        if (this_00 == (QGraphicsGridLayoutEngineItem *)0x0) {
          local_30 = (QGraphicsLayoutItem *)0x0;
        }
        else {
          local_30 = QGraphicsGridLayoutEngineItem::layoutItem(this_00);
        }
        goto LAB_0096e17b;
      }
    }
  }
  QMessageLogger::QMessageLogger
            (in_stack_ffffffffffffffb0,in_RDI,in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98);
  QMessageLogger::warning
            (local_28,"QGraphicsGridLayout::itemAt: invalid row, column %d, %d",(ulong)in_ESI,
             (ulong)in_EDX);
  local_30 = (QGraphicsLayoutItem *)0x0;
LAB_0096e17b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_30;
  }
  __stack_chk_fail();
}

Assistant:

QGraphicsLayoutItem *QGraphicsGridLayout::itemAt(int row, int column) const
{
    Q_D(const QGraphicsGridLayout);
    if (row < 0 || row >= rowCount() || column < 0 || column >= columnCount()) {
        qWarning("QGraphicsGridLayout::itemAt: invalid row, column %d, %d", row, column);
        return nullptr;
    }
    if (QGraphicsGridLayoutEngineItem *engineItem = static_cast<QGraphicsGridLayoutEngineItem*>(d->engine.itemAt(row, column)))
        return engineItem->layoutItem();
    return nullptr;
}